

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::~MemTableIterator(MemTableIterator *this)

{
  MemTableIterator *this_local;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__MemTableIterator_00134b80;
  std::__cxx11::string::~string((string *)&this->tmp_);
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

~MemTableIterator() override = default;